

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

SpecifyBlockSyntax * __thiscall
slang::parsing::Parser::parseSpecifyBlock(Parser *this,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> elements_00;
  Token specify_00;
  Token endspecify_00;
  SpecifyBlockSyntax *pSVar1;
  __extent_storage<18446744073709551615UL> in_RDI;
  anon_class_8_1_8991fb9c *in_stack_000000c0;
  SyntaxKind in_stack_000000cc;
  Token *in_stack_000000d0;
  TokenKind in_stack_000000de;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> members;
  Token endspecify;
  Token specify;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffee0;
  pointer in_stack_fffffffffffffee8;
  ParserBase *in_stack_ffffffffffffff00;
  undefined8 local_38;
  undefined8 local_30;
  
  ParserBase::consume(in_stack_ffffffffffffff00);
  Token::Token((Token *)in_stack_fffffffffffffee0);
  parseMemberList<slang::syntax::MemberSyntax,slang::parsing::Parser::parseSpecifyBlock(std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>)::__0>
            ((Parser *)members._M_ptr,in_stack_000000de,in_stack_000000d0,in_stack_000000cc,
             in_stack_000000c0);
  elements._M_extent._M_extent_value = in_RDI._M_extent_value;
  elements._M_ptr = in_stack_fffffffffffffee8;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            (in_stack_fffffffffffffee0,elements);
  elements_00._M_extent._M_extent_value = in_RDI._M_extent_value;
  elements_00._M_ptr = (pointer)in_stack_fffffffffffffee8;
  slang::syntax::SyntaxList<slang::syntax::MemberSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::MemberSyntax> *)in_stack_fffffffffffffee0,elements_00);
  specify_00.info = (Info *)in_RDI._M_extent_value;
  specify_00._0_8_ = in_stack_fffffffffffffee8;
  endspecify_00.info = local_30;
  endspecify_00._0_8_ = local_38;
  pSVar1 = slang::syntax::SyntaxFactory::specifyBlock
                     ((SyntaxFactory *)local_30,local_38,specify_00,
                      (SyntaxList<slang::syntax::MemberSyntax> *)0x8c385e,endspecify_00);
  return pSVar1;
}

Assistant:

SpecifyBlockSyntax& Parser::parseSpecifyBlock(AttrList attributes) {
    auto specify = consume();

    Token endspecify;
    auto members = parseMemberList<MemberSyntax>(
        TokenKind::EndSpecifyKeyword, endspecify, SyntaxKind::SpecifyBlock,
        [this](SyntaxKind, bool&) { return parseSpecifyItem(); });

    return factory.specifyBlock(attributes, specify, members, endspecify);
}